

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

optional<sub_bound_token> *
read_left_bound_token
          (optional<sub_bound_token> *__return_storage_ptr__,string_view buf_1,string_view buf_2,
          string_view buf_3,string_view buf_4)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  _Storage<operator_token,_true> _Var4;
  char *__s1;
  size_type __rlen;
  _Storage<double,_true> _Var5;
  undefined1 auVar6 [16];
  undefined8 in_XMM0_Qb;
  optional<double> oVar7;
  optional<operator_token> oVar8;
  
  __s1 = buf_1._M_str;
  if ((buf_1._M_len == 1) &&
     ((iVar3 = bcmp(__s1,"+",1), iVar3 == 0 || (iVar3 = bcmp(__s1,"-",1), iVar3 == 0)))) {
    iVar3 = bcmp(__s1,"-",1);
    oVar7 = read_real(buf_2);
    _Var5 = oVar7.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_payload;
    if (((undefined1  [16])
         oVar7.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<sub_bound_token>._M_engaged = false;
      _Var5._M_value = 0.0;
      in_XMM0_Qb = 0;
    }
    if (((undefined1  [16])
         oVar7.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return __return_storage_ptr__;
    }
    oVar8 = read_operator(buf_3,buf_4);
    _Var4 = oVar8.super__Optional_base<operator_token,_true,_true>._M_payload.
            super__Optional_payload_base<operator_token>._M_payload;
    if (((undefined1  [12])
         oVar8.super__Optional_base<operator_token,_true,_true>._M_payload.
         super__Optional_payload_base<operator_token> & (undefined1  [12])0x1) ==
        (undefined1  [12])0x0) {
LAB_0013425a:
      bVar2 = false;
      goto LAB_0013425c;
    }
    auVar1._8_8_ = in_XMM0_Qb;
    auVar1._0_8_ = _Var5;
    auVar6._8_8_ = 0x8000000000000000;
    auVar6._0_8_ = 0x8000000000000000;
    auVar6 = vxorpd_avx512vl(auVar1,auVar6);
    _Var5 = (_Storage<double,_true>)
            ((ulong)(iVar3 == 0) * auVar6._0_8_ + (ulong)(iVar3 != 0) * (long)_Var5);
    iVar3 = 2;
  }
  else {
    oVar7 = read_real(buf_1);
    _Var5 = oVar7.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_payload;
    if (((undefined1  [16])
         oVar7.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<sub_bound_token>._M_engaged = false;
      _Var5._M_value = 0.0;
    }
    if (((undefined1  [16])
         oVar7.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return __return_storage_ptr__;
    }
    oVar8 = read_operator(buf_2,buf_3);
    _Var4 = oVar8.super__Optional_base<operator_token,_true,_true>._M_payload.
            super__Optional_payload_base<operator_token>._M_payload;
    if (((undefined1  [12])
         oVar8.super__Optional_base<operator_token,_true,_true>._M_payload.
         super__Optional_payload_base<operator_token> & (undefined1  [12])0x1) ==
        (undefined1  [12])0x0) goto LAB_0013425a;
    iVar3 = 1;
  }
  (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
  super__Optional_payload_base<sub_bound_token>._M_payload._M_value.value = (double)_Var5;
  (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
  super__Optional_payload_base<sub_bound_token>._M_payload._M_value.read =
       _Var4._M_value.read + iVar3;
  (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
  super__Optional_payload_base<sub_bound_token>._M_payload._M_value.op = _Var4._M_value.op;
  bVar2 = true;
LAB_0013425c:
  (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
  super__Optional_payload_base<sub_bound_token>._M_engaged = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::optional<sub_bound_token>
read_left_bound_token(const std::string_view buf_1,
                      const std::string_view buf_2,
                      const std::string_view buf_3,
                      const std::string_view buf_4) noexcept
{
    double value = 0.0;
    double negative = 1.0;

    if (buf_1 == "+" || buf_1 == "-") {
        if (buf_1 == "-")
            negative = -1.0;

        if (auto value_opt = read_real(buf_2); value_opt)
            value = *value_opt;
        else
            return std::nullopt;

        if (auto operator_token = read_operator(buf_3, buf_4); operator_token)
            return sub_bound_token(
              value * negative, operator_token->read + 2, operator_token->op);
        else
            return std::nullopt;
    } else {
        if (auto value_opt = read_real(buf_1); value_opt)
            value = *value_opt;
        else
            return std::nullopt;

        if (auto operator_token = read_operator(buf_2, buf_3); operator_token)
            return sub_bound_token(
              value * negative, operator_token->read + 1, operator_token->op);
        else
            return std::nullopt;
    }
}